

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O1

shared_ptr<ear::PointSourcePanner> __thiscall
ear::configureAllocentricPanner(ear *this,Layout *layout)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar1;
  shared_ptr<ear::PointSourcePanner> sVar2;
  
  checkScreenSpeakers(layout);
  puVar1 = (undefined8 *)operator_new(0x18);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_001e3c38;
  puVar1[2] = &PTR_handle_001e3af0;
  *(undefined8 **)this = puVar1 + 2;
  *(undefined8 **)(this + 8) = puVar1;
  sVar2.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_handle_001e3af0;
  sVar2.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<ear::PointSourcePanner>)
         sVar2.super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<PointSourcePanner> configureAllocentricPanner(
      const Layout& layout) {
    checkScreenSpeakers(layout);
    return std::make_shared<AllocentricPanner>();
  }